

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O0

int fwd_on_outgoing_interest
              (uint8_t *interest,size_t length,uint8_t *name,size_t name_len,ndn_pit_entry_t *entry,
              ndn_table_id_t face_id)

{
  ndn_fib_entry_t *pnVar1;
  uint8_t *puVar2;
  ndn_bitset_t nVar3;
  ndn_bitset_t outfaces;
  uint8_t *hop_limit;
  int strategy;
  ndn_fib_entry_t *fib_entry;
  ndn_table_id_t face_id_local;
  ndn_pit_entry_t *entry_local;
  size_t name_len_local;
  uint8_t *name_local;
  size_t length_local;
  uint8_t *interest_local;
  
  pnVar1 = ndn_fib_prefix_match(forwarder.fib,name,name_len);
  if (pnVar1 == (ndn_fib_entry_t *)0x0) {
    printf("ERROR: %s, L%d: ","fwd_on_outgoing_interest",0x1b4);
    printf("[FORWARDER] Drop by no route\n");
    interest_local._4_4_ = -0x38;
  }
  else {
    if (pnVar1->on_interest == (ndn_on_interest_func)0x0) {
      hop_limit._4_4_ = 1;
    }
    else {
      hop_limit._4_4_ = (*pnVar1->on_interest)(interest,(uint32_t)length,pnVar1->userdata);
    }
    if (entry->nametree_id == 0xffff) {
      interest_local._4_4_ = 0;
    }
    else {
      puVar2 = tlv_interest_get_hoplimit_ptr(interest,length);
      if (puVar2 != (uint8_t *)0x0) {
        if (*puVar2 == '\0') {
          return -0x37;
        }
        if (face_id != 0xffff) {
          *puVar2 = *puVar2 + 0xff;
        }
      }
      if (hop_limit._4_4_ == 1) {
        nVar3 = fwd_multicast(interest,length,
                              pnVar1->nexthop & (entry->outgoing_faces ^ 0xffffffffffffffff),face_id
                             );
        entry->outgoing_faces = nVar3 | entry->outgoing_faces;
      }
      interest_local._4_4_ = 0;
    }
  }
  return interest_local._4_4_;
}

Assistant:

static int
fwd_on_outgoing_interest(uint8_t* interest,
                         size_t length,
                         uint8_t* name,
                         size_t name_len,
                         ndn_pit_entry_t* entry,
                         ndn_table_id_t face_id)
{
  ndn_fib_entry_t* fib_entry;
  int strategy;
  uint8_t *hop_limit;
  ndn_bitset_t outfaces;

  fib_entry = ndn_fib_prefix_match(forwarder.fib, name, name_len);
  if(fib_entry == NULL){
    NDN_LOG_ERROR("[FORWARDER] Drop by no route\n");
    return NDN_FWD_NO_ROUTE;
  }

  if(fib_entry->on_interest){
    strategy = fib_entry->on_interest(interest, length, fib_entry->userdata);
  }else{
    strategy = NDN_FWD_STRATEGY_MULTICAST;
  }

  // The interest may be satisfied immediately so check again
  if(entry->nametree_id == NDN_INVALID_ID){
    return NDN_SUCCESS;
  }

  hop_limit = tlv_interest_get_hoplimit_ptr(interest, length);
  if(hop_limit != NULL){
    if(*hop_limit <= 0){
      return NDN_FWD_INTEREST_REJECTED;
    }
    // If the Interest is received from another hop
    if(face_id != NDN_INVALID_ID){
      *hop_limit -= 1;
    }
  }

  outfaces = (fib_entry->nexthop & (~entry->outgoing_faces));
  if(strategy == NDN_FWD_STRATEGY_MULTICAST){
    entry->outgoing_faces |= fwd_multicast(interest, length, outfaces, face_id);
  }

  return NDN_SUCCESS;
}